

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int ly_set_merge(ly_set *trg,ly_set *src,int options)

{
  LY_ERR no;
  int iVar1;
  lys_node **__ptr;
  uint uVar2;
  char *format;
  uint uVar3;
  
  if (trg == (ly_set *)0x0) {
    format = "Invalid arguments (%s()).";
    no = LY_EINVAL;
LAB_0016773a:
    ly_log((ly_ctx *)0x0,LY_LLERR,no,format,"ly_set_merge");
    uVar3 = 0xffffffff;
  }
  else {
    if (src == (ly_set *)0x0) {
      return 0;
    }
    if ((options & 1U) == 0) {
      uVar3 = 0;
      do {
        while( true ) {
          uVar2 = src->number;
          if (uVar2 <= uVar3) goto LAB_00167754;
          iVar1 = ly_set_contains(trg,(src->set).s[uVar3]);
          if (iVar1 < 0) break;
          ly_set_rm_index(src,uVar3);
        }
        uVar3 = uVar3 + 1;
      } while( true );
    }
    uVar2 = src->number;
LAB_00167754:
    uVar3 = trg->number;
    __ptr = (trg->set).s;
    if (trg->size < uVar2 + uVar3) {
      __ptr = (lys_node **)realloc(__ptr,(ulong)(uVar2 + uVar3) << 3);
      if (__ptr == (lys_node **)0x0) {
        format = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        goto LAB_0016773a;
      }
      uVar3 = trg->number;
      trg->size = src->number + uVar3;
      (trg->set).s = __ptr;
      uVar2 = src->number;
    }
    memcpy(__ptr + uVar3,(src->set).s,(ulong)uVar2 << 3);
    uVar3 = src->number;
    trg->number = trg->number + uVar3;
    ly_set_free(src);
  }
  return uVar3;
}

Assistant:

API int
ly_set_merge(struct ly_set *trg, struct ly_set *src, int options)
{
    unsigned int i, ret;
    void **new;

    if (!trg) {
        LOGARG;
        return -1;
    }

    if (!src) {
        return 0;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* remove duplicates */
        i = 0;
        while (i < src->number) {
            if (ly_set_contains(trg, src->set.g[i]) > -1) {
                ly_set_rm_index(src, i);
            } else {
                ++i;
            }
        }
    }

    /* allocate more memory if needed */
    if (trg->size < trg->number + src->number) {
        new = realloc(trg->set.g, (trg->number + src->number) * sizeof *(trg->set.g));
        LY_CHECK_ERR_RETURN(!new, LOGMEM(NULL), -1);
        trg->size = trg->number + src->number;
        trg->set.g = new;
    }

    /* copy contents from src into trg */
    memcpy(trg->set.g + trg->number, src->set.g, src->number * sizeof *(src->set.g));
    ret = src->number;
    trg->number += ret;

    /* cleanup */
    ly_set_free(src);
    return ret;
}